

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O3

void __thiscall
std::
_Head_base<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_false>
::~_Head_base(_Head_base<1UL,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_false>
              *this)

{
  anon_struct_8_0_00000001_for___align aVar1;
  anon_struct_8_0_00000001_for___align aVar2;
  
  if ((this->_M_head_impl).valid_ == true) {
    (this->_M_head_impl).valid_ = false;
    aVar1 = (this->_M_head_impl).storage_.__align;
    aVar2 = (anon_struct_8_0_00000001_for___align)((long)&(this->_M_head_impl).storage_ + 0x10);
    if (aVar1 != aVar2) {
      operator_delete((void *)aVar1,*(long *)aVar2 + 1);
      return;
    }
  }
  return;
}

Assistant:

void reset () noexcept {
            if (valid_) {
                // Set valid_ to false before calling the dtor.
                valid_ = false;
                reinterpret_cast<T const *> (&storage_)->~T ();
            }
        }